

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O3

void Parser::MapBindIdentifier<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
               (ParseNodePtr patternNode,anon_class_24_3_c793ac44 handler)

{
  ParseNode *this;
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  ParseNodeBin *pPVar4;
  undefined4 *puVar5;
  ParseNodeArrLit *pPVar6;
  ParseNodeUni *pPVar7;
  ParseNodePtr *ppPVar8;
  ParseNodePtr *ppPVar9;
  ParseNodePtr pPVar10;
  ParseNodePtr local_38;
  
  OVar3 = patternNode->nop;
  if (OVar3 == knopAsg) {
    pPVar4 = ParseNode::AsParseNodeBin(patternNode);
    patternNode = pPVar4->pnode1;
    OVar3 = patternNode->nop;
  }
  if ((OVar3 & ~knopInt) != knopObjectPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2e8,"(patternNode->IsPattern())","patternNode->IsPattern()");
    if (!bVar2) {
LAB_00818afc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    OVar3 = patternNode->nop;
  }
  if (OVar3 == knopArrayPattern) {
    pPVar6 = ParseNode::AsParseNodeArrLit(patternNode);
    pPVar10 = (pPVar6->super_ParseNodeUni).pnode1;
    if (pPVar10 != (ParseNodePtr)0x0) {
      ppPVar9 = &local_38;
      local_38 = pPVar10;
      do {
        if (pPVar10->nop != knopList) {
LAB_00818ad7:
          MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                    (pPVar10,handler);
          return;
        }
        pPVar4 = ParseNode::AsParseNodeBin(pPVar10);
        MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                  (pPVar4->pnode1,handler);
        pPVar4 = ParseNode::AsParseNodeBin(*ppPVar9);
        pPVar10 = pPVar4->pnode2;
        ppPVar9 = &pPVar4->pnode2;
      } while (pPVar10 != (ParseNodePtr)0x0);
    }
  }
  else {
    pPVar7 = ParseNode::AsParseNodeUni(patternNode);
    pPVar10 = pPVar7->pnode1;
    local_38 = pPVar10;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    if (pPVar10 != (ParseNodePtr)0x0) {
      ppPVar9 = &local_38;
      do {
        OVar3 = pPVar10->nop;
        if (OVar3 != knopList) {
          if ((OVar3 != knopEllipsis) && (OVar3 != knopObjectPatternMember)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                               ,0x2f2,
                               "(item->nop == knopObjectPatternMember || item->nop == knopEllipsis)"
                               ,"item->nop == knopObjectPatternMember || item->nop == knopEllipsis")
            ;
            if (!bVar2) goto LAB_00818afc;
            *puVar5 = 0;
            OVar3 = pPVar10->nop;
          }
          if (OVar3 == knopObjectPatternMember) {
            pPVar4 = ParseNode::AsParseNodeBin(pPVar10);
            ppPVar9 = &pPVar4->pnode2;
          }
          else {
            pPVar7 = ParseNode::AsParseNodeUni(pPVar10);
            ppPVar9 = &pPVar7->pnode1;
          }
          pPVar10 = *ppPVar9;
          goto LAB_00818ad7;
        }
        pPVar4 = ParseNode::AsParseNodeBin(pPVar10);
        this = pPVar4->pnode1;
        OVar3 = this->nop;
        if ((OVar3 != knopEllipsis) && (OVar3 != knopObjectPatternMember)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                             ,0x2f2,
                             "(item->nop == knopObjectPatternMember || item->nop == knopEllipsis)",
                             "item->nop == knopObjectPatternMember || item->nop == knopEllipsis");
          if (!bVar2) goto LAB_00818afc;
          *puVar5 = 0;
          OVar3 = this->nop;
        }
        if (OVar3 == knopObjectPatternMember) {
          pPVar4 = ParseNode::AsParseNodeBin(this);
          ppPVar8 = &pPVar4->pnode2;
        }
        else {
          pPVar7 = ParseNode::AsParseNodeUni(this);
          ppPVar8 = &pPVar7->pnode1;
        }
        MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitFunction(ParseNodeFnc*)::__6>
                  (*ppPVar8,handler);
        pPVar4 = ParseNode::AsParseNodeBin(*ppPVar9);
        pPVar10 = pPVar4->pnode2;
        ppPVar9 = &pPVar4->pnode2;
      } while (pPVar10 != (ParseNodePtr)0x0);
    }
  }
  return;
}

Assistant:

static void MapBindIdentifier(ParseNodePtr patternNode, THandler handler)
    {
        if (patternNode->nop == knopAsg)
        {
            patternNode = patternNode->AsParseNodeBin()->pnode1;
        }

        Assert(patternNode->IsPattern());
        if (patternNode->nop == knopArrayPattern)
        {
            ForEachItemInList(patternNode->AsParseNodeArrLit()->pnode1, [&](ParseNodePtr item) {
                MapBindIdentifierFromElement(item, handler);
            });
        }
        else
        {
            ForEachItemInList(patternNode->AsParseNodeUni()->pnode1, [&](ParseNodePtr item) {
                Assert(item->nop == knopObjectPatternMember || item->nop == knopEllipsis);
                if (item->nop == knopObjectPatternMember)
                {
                    MapBindIdentifierFromElement(item->AsParseNodeBin()->pnode2, handler);
                }
                else
                {
                    MapBindIdentifierFromElement(item->AsParseNodeUni()->pnode1, handler);
                }
            });
        }
    }